

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O0

void __thiscall minihttp::DLSocket::_OnRecv(DLSocket *this,void *incoming,uint size)

{
  bool bVar1;
  char *pcVar2;
  size_t __size;
  uint size_local;
  void *incoming_local;
  DLSocket *this_local;
  
  if ((size != 0) && (bVar1 = HttpSocket::IsSuccess(&this->super_HttpSocket), bVar1)) {
    if (this->bufcap <= this->bufsz + (ulong)size + 1) {
      this->bufcap = (this->bufcap >> 1) + (ulong)size + 1 + this->bufcap;
      __size = this->bufcap;
      pcVar2 = (char *)realloc(this->buf,__size);
      this->buf = pcVar2;
      if (this->buf == (char *)0x0) {
        this->fail = true;
        TcpSocket::close((TcpSocket *)this,(int)__size);
      }
    }
    memcpy(this->buf + this->bufsz,incoming,(ulong)size);
    this->bufsz = (ulong)size + this->bufsz;
  }
  return;
}

Assistant:

void _OnRecv(void *incoming, unsigned size)
    {
        if(!size || !IsSuccess())
            return;
        if(bufsz + size + 1 >= bufcap) // always make sure there's 1 more byte free for the zero-terminator
        {
            bufcap += (bufcap / 2) + size + 1;
            buf = (char*)realloc(buf, bufcap);
            if(!buf)
            {
                fail = true;
                close();
            }
        }
        memcpy(buf + bufsz, incoming, size);
        bufsz += size;
    }